

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimpleBroadphase.cpp
# Opt level: O2

void __thiscall
cbtSimpleBroadphase::aabbTest
          (cbtSimpleBroadphase *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,
          cbtBroadphaseAabbCallback *callback)

{
  cbtSimpleBroadphaseProxy *pcVar1;
  bool bVar2;
  int i;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  for (lVar3 = 0; lVar3 <= this->m_LastHandleIndex; lVar3 = lVar3 + 1) {
    pcVar1 = this->m_pHandles;
    if (*(long *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar4 + -0x14) != 0)
    {
      bVar2 = TestAabbAgainstAabb2
                        (aabbMin,aabbMax,
                         (cbtVector3 *)
                         ((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar4),
                         (cbtVector3 *)
                         ((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMax.m_floats + lVar4));
      if (bVar2) {
        (*callback->_vptr_cbtBroadphaseAabbCallback[2])
                  (callback,(long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
                            lVar4 + -0x14);
      }
    }
    lVar4 = lVar4 + 0x38;
  }
  return;
}

Assistant:

void cbtSimpleBroadphase::aabbTest(const cbtVector3& aabbMin, const cbtVector3& aabbMax, cbtBroadphaseAabbCallback& callback)
{
	for (int i = 0; i <= m_LastHandleIndex; i++)
	{
		cbtSimpleBroadphaseProxy* proxy = &m_pHandles[i];
		if (!proxy->m_clientObject)
		{
			continue;
		}
		if (TestAabbAgainstAabb2(aabbMin, aabbMax, proxy->m_aabbMin, proxy->m_aabbMax))
		{
			callback.process(proxy);
		}
	}
}